

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int __thiscall asl::Socket_::connect(Socket_ *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Type TVar1;
  Type TVar2;
  socklen_t __len_00;
  sockaddr *__addr_00;
  int iVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,__fd);
  if (*(int *)(*plVar4 + -0x10) != 0) {
    TVar1 = *(Type *)(plVar4 + 1);
    TVar2 = this->_family;
    this->_family = TVar1;
    init(this,(EVP_PKEY_CTX *)(ulong)(TVar2 != TVar1));
    __addr_00 = (sockaddr *)*plVar4;
    __len_00._0_2_ = __addr_00[-1].sa_family;
    __len_00._2_1_ = __addr_00[-1].sa_data[0];
    __len_00._3_1_ = __addr_00[-1].sa_data[1];
    iVar3 = ::connect(*(int *)&(this->super_SmartObject_).field_0xc,__addr_00,__len_00);
    if (iVar3 == 0) {
      return 1;
    }
  }
  this->_error = 3;
  return 0;
}

Assistant:

bool Socket_::connect(const InetAddress& addr)
{
	if (addr.length() == 0)
	{
		_error = SOCKET_BAD_CONNECT;
		return false;
	}
	bool force = _family != addr.type();
	_family = addr.type();
	init(force);
	if (::connect(_handle, (const sockaddr*)addr.ptr(), addr.length()) == 0)
		return true;
	_error = SOCKET_BAD_CONNECT;
	return false;
}